

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

bool __thiscall re2::Regexp::ParseState::ParsePerlFlags(ParseState *this,StringPiece *s)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  RegexpStatus *pRVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  size_type sVar8;
  ulong uVar9;
  ParseFlags PVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  int iVar14;
  StringPiece t;
  Rune c;
  uint local_1a8 [94];
  
  t.ptr_ = s->ptr_;
  t.length_ = s->length_;
  t._12_4_ = *(undefined4 *)&s->field_0xc;
  PVar10 = this->flags_;
  if (((((PVar10 >> 9 & 1) == 0) || (t.length_ < 2)) || (*t.ptr_ != '(')) || (t.ptr_[1] != '?')) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&c,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/parse.cc",0x776
              );
    std::operator<<((ostream *)local_1a8,"Bad call to ParseState::ParsePerlFlags");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&c);
    this->status_->code_ = kRegexpInternalError;
  }
  else {
    pcVar1 = t.ptr_ + 2;
    t.length_ = t.length_ - 2;
    if ((((uint)t.length_ < 3) || (*pcVar1 != 'P')) || (t.ptr_[3] != '<')) {
      bVar7 = false;
      bVar5 = 0;
      t.ptr_ = pcVar1;
      do {
        bVar13 = false;
        bVar6 = bVar7;
        while( true ) {
          while( true ) {
            do {
              bVar7 = bVar6;
              if (bVar13) {
                if ((bool)(~bVar7 | bVar5)) {
                  this->flags_ = PVar10;
                  s->length_ = t.length_;
                  s->ptr_ = t.ptr_;
                  return true;
                }
                goto LAB_00139e27;
              }
              if (t.length_ == 0) goto LAB_00139e27;
              iVar14 = StringPieceToRune(&c,&t,this->status_);
              if (iVar14 < 0) {
                return false;
              }
              bVar13 = true;
              bVar6 = bVar7;
            } while (c == 0x29);
            if (c != 0x2d) break;
            bVar5 = 0;
            bVar13 = false;
            bVar6 = true;
            if (bVar7) goto LAB_00139e27;
          }
          if (c != 0x3a) break;
          DoLeftParenNoCapture(this);
        }
        if (c == 0x55) {
          if (bVar7) {
            PVar10 = PVar10 & ~NonGreedy;
          }
          else {
            PVar10 = PVar10 | NonGreedy;
          }
        }
        else if (c == 0x73) {
          if (bVar7) {
            PVar10 = PVar10 & ~DotNL;
          }
          else {
            PVar10 = PVar10 | DotNL;
          }
        }
        else if (c == 0x6d) {
          if (bVar7) {
            PVar10 = PVar10 | OneLine;
          }
          else {
            PVar10 = PVar10 & ~OneLine;
          }
        }
        else {
          if (c != 0x69) {
LAB_00139e27:
            pRVar4 = this->status_;
            pRVar4->code_ = kRegexpBadPerlOp;
            pcVar1 = s->ptr_;
            (pRVar4->error_arg_).ptr_ = pcVar1;
            (pRVar4->error_arg_).length_ = (int)t.ptr_ - (int)pcVar1;
            return false;
          }
          if (bVar7) {
            PVar10 = PVar10 & ~FoldCase;
          }
          else {
            PVar10 = PVar10 | FoldCase;
          }
        }
        bVar5 = 1;
      } while( true );
    }
    t.ptr_ = pcVar1;
    sVar8 = StringPiece::find(&t,'>',2);
    pcVar1 = t.ptr_;
    if (sVar8 == 0xffffffffffffffff) {
      bVar7 = IsValidUTF8(s,this->status_);
      if (bVar7) {
        pRVar4 = this->status_;
        pRVar4->code_ = kRegexpBadNamedCapture;
        (pRVar4->error_arg_).ptr_ = s->ptr_;
        (pRVar4->error_arg_).length_ = s->length_;
      }
    }
    else {
      pcVar2 = t.ptr_ + 2;
      uVar11 = (int)sVar8 - 2;
      _c = pcVar2;
      local_1a8[0] = uVar11;
      bVar7 = IsValidUTF8((StringPiece *)&c,this->status_);
      if (bVar7) {
        iVar14 = (int)sVar8 + 3;
        if (uVar11 != 0) {
          uVar9 = 0;
          uVar12 = (ulong)uVar11;
          if ((int)uVar11 < 1) {
            uVar12 = uVar9;
          }
          while( true ) {
            if (uVar12 == uVar9) {
              DoLeftParen(this,(StringPiece *)&c);
              iVar14 = ((int)(pcVar1 + -2) + iVar14) - (int)s->ptr_;
              s->ptr_ = s->ptr_ + iVar14;
              s->length_ = s->length_ - iVar14;
              return true;
            }
            cVar3 = pcVar2[uVar9];
            if ((0x19 < (byte)(cVar3 + 0x9fU) && 9 < (byte)(cVar3 - 0x30U)) &&
               (cVar3 != '_' && 0x19 < (byte)(cVar3 + 0xbfU))) break;
            uVar9 = uVar9 + 1;
          }
        }
        pRVar4 = this->status_;
        pRVar4->code_ = kRegexpBadNamedCapture;
        (pRVar4->error_arg_).ptr_ = pcVar1 + -2;
        (pRVar4->error_arg_).length_ = iVar14;
      }
    }
  }
  return false;
}

Assistant:

bool Regexp::ParseState::ParsePerlFlags(StringPiece* s) {
  StringPiece t = *s;

  // Caller is supposed to check this.
  if (!(flags_ & PerlX) || t.size() < 2 || t[0] != '(' || t[1] != '?') {
    LOG(DFATAL) << "Bad call to ParseState::ParsePerlFlags";
    status_->set_code(kRegexpInternalError);
    return false;
  }

  t.remove_prefix(2);  // "(?"

  // Check for named captures, first introduced in Python's regexp library.
  // As usual, there are three slightly different syntaxes:
  //
  //   (?P<name>expr)   the original, introduced by Python
  //   (?<name>expr)    the .NET alteration, adopted by Perl 5.10
  //   (?'name'expr)    another .NET alteration, adopted by Perl 5.10
  //
  // Perl 5.10 gave in and implemented the Python version too,
  // but they claim that the last two are the preferred forms.
  // PCRE and languages based on it (specifically, PHP and Ruby)
  // support all three as well.  EcmaScript 4 uses only the Python form.
  //
  // In both the open source world (via Code Search) and the
  // Google source tree, (?P<expr>name) is the dominant form,
  // so that's the one we implement.  One is enough.
  if (t.size() > 2 && t[0] == 'P' && t[1] == '<') {
    // Pull out name.
    size_t end = t.find('>', 2);
    if (end == t.npos) {
      if (!IsValidUTF8(*s, status_))
        return false;
      status_->set_code(kRegexpBadNamedCapture);
      status_->set_error_arg(*s);
      return false;
    }

    // t is "P<name>...", t[end] == '>'
    StringPiece capture(t.begin()-2, static_cast<int>(end)+3);  // "(?P<name>"
    StringPiece name(t.begin()+2, static_cast<int>(end)-2);     // "name"
    if (!IsValidUTF8(name, status_))
      return false;
    if (!IsValidCaptureName(name)) {
      status_->set_code(kRegexpBadNamedCapture);
      status_->set_error_arg(capture);
      return false;
    }

    if (!DoLeftParen(name)) {
      // DoLeftParen's failure set status_.
      return false;
    }

    s->remove_prefix(static_cast<int>(capture.end() - s->begin()));
    return true;
  }

  bool negated = false;
  bool sawflags = false;
  int nflags = flags_;
  Rune c;
  for (bool done = false; !done; ) {
    if (t.size() == 0)
      goto BadPerlOp;
    if (StringPieceToRune(&c, &t, status_) < 0)
      return false;
    switch (c) {
      default:
        goto BadPerlOp;

      // Parse flags.
      case 'i':
        sawflags = true;
        if (negated)
          nflags &= ~FoldCase;
        else
          nflags |= FoldCase;
        break;

      case 'm':  // opposite of our OneLine
        sawflags = true;
        if (negated)
          nflags |= OneLine;
        else
          nflags &= ~OneLine;
        break;

      case 's':
        sawflags = true;
        if (negated)
          nflags &= ~DotNL;
        else
          nflags |= DotNL;
        break;

      case 'U':
        sawflags = true;
        if (negated)
          nflags &= ~NonGreedy;
        else
          nflags |= NonGreedy;
        break;

      // Negation
      case '-':
        if (negated)
          goto BadPerlOp;
        negated = true;
        sawflags = false;
        break;

      // Open new group.
      case ':':
        if (!DoLeftParenNoCapture()) {
          // DoLeftParenNoCapture's failure set status_.
          return false;
        }
        done = true;
        break;

      // Finish flags.
      case ')':
        done = true;
        break;
    }
  }

  if (negated && !sawflags)
    goto BadPerlOp;

  flags_ = static_cast<Regexp::ParseFlags>(nflags);
  *s = t;
  return true;

BadPerlOp:
  status_->set_code(kRegexpBadPerlOp);
  status_->set_error_arg(
      StringPiece(s->begin(), static_cast<int>(t.begin() - s->begin())));
  return false;
}